

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.cpp
# Opt level: O2

size_t __thiscall
Memory::check_memory
          (Memory *this,PatternAddressMapper *mapping,bool reproducibility_mode,bool verbose)

{
  pointer pBVar1;
  _Hash_node_base *start;
  _Hashtable<volatile_char_*,_volatile_char_*,_std::allocator<volatile_char_*>,_std::__detail::_Identity,_std::equal_to<volatile_char_*>,_std::hash<volatile_char_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *__ht;
  char *end;
  size_t sVar2;
  undefined7 in_register_00000011;
  size_t sVar3;
  size_type *psVar4;
  undefined1 local_c0 [8];
  unordered_set<volatile_char_*,_std::hash<volatile_char_*>,_std::equal_to<volatile_char_*>,_std::allocator<volatile_char_*>_>
  victim_rows;
  undefined1 local_68 [8];
  DRAMAddr victim_dram_addr;
  allocator<char> local_35;
  uint local_34;
  
  local_34 = (uint)CONCAT71(in_register_00000011,reproducibility_mode);
  pBVar1 = (this->flipped_bits).super__Vector_base<BitFlip,_std::allocator<BitFlip>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->flipped_bits).super__Vector_base<BitFlip,_std::allocator<BitFlip>_>._M_impl.
      super__Vector_impl_data._M_finish != pBVar1) {
    (this->flipped_bits).super__Vector_base<BitFlip,_std::allocator<BitFlip>_>._M_impl.
    super__Vector_impl_data._M_finish = pBVar1;
  }
  __ht = &PatternAddressMapper::get_victim_rows(mapping)->_M_h;
  std::
  _Hashtable<volatile_char_*,_volatile_char_*,_std::allocator<volatile_char_*>,_std::__detail::_Identity,_std::equal_to<volatile_char_*>,_std::hash<volatile_char_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::_Hashtable((_Hashtable<volatile_char_*,_volatile_char_*,_std::allocator<volatile_char_*>,_std::__detail::_Identity,_std::equal_to<volatile_char_*>,_std::hash<volatile_char_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                *)local_c0,__ht);
  if (verbose) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&victim_rows._M_h._M_single_bucket,"Checking %zu victims for bit flips.",
               &local_35);
    format_string<unsigned_long>
              ((string *)local_68,(string *)&victim_rows._M_h._M_single_bucket,
               (unsigned_long)victim_rows._M_h._M_before_begin._M_nxt);
    Logger::log_info((string *)local_68,true);
    std::__cxx11::string::~string((string *)local_68);
    std::__cxx11::string::~string((string *)&victim_rows._M_h._M_single_bucket);
  }
  psVar4 = &victim_rows._M_h._M_bucket_count;
  sVar3 = 0;
  local_34 = local_34 & 0xff;
  while (psVar4 = (size_type *)*psVar4, psVar4 != (size_type *)0x0) {
    DRAMAddr::DRAMAddr((DRAMAddr *)local_68,((__node_base *)(psVar4 + 1))->_M_nxt);
    DRAMAddr::add_inplace((DRAMAddr *)local_68,0,1,0);
    start = ((__node_base *)(psVar4 + 1))->_M_nxt;
    end = (char *)DRAMAddr::to_virt((DRAMAddr *)local_68);
    sVar2 = check_memory_internal(this,mapping,(char *)start,end,SUB41(local_34,0),verbose);
    sVar3 = sVar3 + sVar2;
  }
  std::
  _Hashtable<volatile_char_*,_volatile_char_*,_std::allocator<volatile_char_*>,_std::__detail::_Identity,_std::equal_to<volatile_char_*>,_std::hash<volatile_char_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<volatile_char_*,_volatile_char_*,_std::allocator<volatile_char_*>,_std::__detail::_Identity,_std::equal_to<volatile_char_*>,_std::hash<volatile_char_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_c0);
  return sVar3;
}

Assistant:

size_t Memory::check_memory(PatternAddressMapper &mapping, bool reproducibility_mode, bool verbose) {
  flipped_bits.clear();

  auto victim_rows = mapping.get_victim_rows();
  if (verbose) Logger::log_info(format_string("Checking %zu victims for bit flips.", victim_rows.size()));

  size_t sum_found_bitflips = 0;
  for (const auto &victim_row : victim_rows) {
    auto victim_dram_addr = DRAMAddr((char*)victim_row);
    victim_dram_addr.add_inplace(0, 1, 0);
    sum_found_bitflips += check_memory_internal(mapping, victim_row,
        (volatile char *) victim_dram_addr.to_virt(), reproducibility_mode, verbose);
  }
  return sum_found_bitflips;
}